

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_promotion.c
# Opt level: O1

value value_type_promotion_integer(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  size_t sVar2;
  value pvVar3;
  value pvVar4;
  char buffer [8];
  undefined8 local_28;
  
  local_28 = 0;
  id_00 = value_type_id(v);
  iVar1 = type_id_integer(id_00);
  if (iVar1 == 0) {
    iVar1 = type_id_integer(id);
    pvVar4 = (value)0x0;
    if (((id_00 <= id) && (iVar1 == 0)) && (pvVar4 = v, id_00 != id)) {
      sVar2 = value_type_id_size(id_00);
      value_to(v,&local_28,sVar2);
      sVar2 = value_type_id_size(id);
      pvVar3 = value_type_create(&local_28,sVar2,id);
      if (pvVar3 != (value)0x0) {
        value_destroy(v);
        pvVar4 = pvVar3;
      }
    }
  }
  else {
    pvVar4 = (value)0x0;
  }
  return pvVar4;
}

Assistant:

value value_type_promotion_integer(value v, type_id id)
{
	char buffer[8] = { 0 };

	value promotion = NULL;

	type_id v_id = value_type_id(v);

	if (type_id_integer(v_id) != 0 || type_id_integer(id) != 0 || v_id > id)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	value_to(v, (void *)&buffer[0], value_type_id_size(v_id));

	promotion = value_type_create((void *)&buffer[0], value_type_id_size(id), id);

	if (promotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	return promotion;
}